

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hatch.cpp
# Opt level: O1

void __thiscall
ON_OBSOLETE_V5_HatchExtra::ON_OBSOLETE_V5_HatchExtra(ON_OBSOLETE_V5_HatchExtra *this)

{
  double dVar1;
  ON_UUID OVar2;
  
  ON_UserData::ON_UserData(&this->super_ON_UserData);
  (this->super_ON_UserData).super_ON_Object._vptr_ON_Object = (_func_int **)&PTR_ClassId_0081ef10;
  dVar1 = ON_2dPoint::Origin.y;
  (this->m_basepoint).x = ON_2dPoint::Origin.x;
  (this->m_basepoint).y = dVar1;
  OVar2 = ON_ClassId::Uuid(&m_ON_OBSOLETE_V5_HatchExtra_class_rtti);
  (this->super_ON_UserData).m_userdata_uuid = OVar2;
  (this->super_ON_UserData).m_application_uuid.Data1 = 0xc8cda597;
  (this->super_ON_UserData).m_application_uuid.Data2 = 0xd957;
  (this->super_ON_UserData).m_application_uuid.Data3 = 0x4625;
  (this->super_ON_UserData).m_application_uuid.Data4[0] = 0xa4;
  (this->super_ON_UserData).m_application_uuid.Data4[1] = 0xb3;
  (this->super_ON_UserData).m_application_uuid.Data4[2] = 0xa0;
  (this->super_ON_UserData).m_application_uuid.Data4[3] = 0xb5;
  (this->super_ON_UserData).m_application_uuid.Data4[4] = '\x10';
  (this->super_ON_UserData).m_application_uuid.Data4[5] = 0xfc;
  (this->super_ON_UserData).m_application_uuid.Data4[6] = '0';
  (this->super_ON_UserData).m_application_uuid.Data4[7] = 0xd4;
  (this->super_ON_UserData).m_userdata_copycount = 0;
  return;
}

Assistant:

ON_OBSOLETE_V5_HatchExtra::ON_OBSOLETE_V5_HatchExtra()
{
  m_userdata_uuid = ON_CLASS_ID(ON_OBSOLETE_V5_HatchExtra);
  m_application_uuid = ON_opennurbs5_id; // opennurbs.dll reads/writes this userdata
                                         // The id must be the version 5 id because
                                         // V6 SaveAs V5 needs to work, but SaveAs
                                         // V4 should not write this userdata.   
  m_userdata_copycount = 0;
}